

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

void Bac_ManWriteConcat(Bac_Ntk_t *p,int iStart,int nObjs)

{
  int iVar1;
  Vec_Str_t *p_00;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar13;
  size_t sVar14;
  char cVar15;
  int i_1;
  int i;
  int iVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  uint local_58;
  ulong uVar12;
  
  if (nObjs < 1) {
    __assert_fail("nObjs >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x11e,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
  }
  if (nObjs == 1) {
    Bac_ManWriteSig(p,iStart);
    return;
  }
  p_00 = p->pDesign->vOut;
  uVar4 = p_00->nCap;
  if (p_00->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar14 = 0x10;
    }
    else {
      sVar14 = (ulong)uVar4 * 2;
      if ((int)sVar14 <= (int)uVar4) goto LAB_003a054e;
      if (p_00->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar14);
      }
      else {
        pcVar7 = (char *)realloc(p_00->pArray,sVar14);
      }
    }
    p_00->pArray = pcVar7;
    p_00->nCap = (int)sVar14;
  }
LAB_003a054e:
  iVar8 = p_00->nSize;
  p_00->nSize = iVar8 + 1;
  p_00->pArray[iVar8] = '{';
  if ((iStart < 0) || ((p->vType).nSize <= iStart)) {
LAB_003a1134:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  bVar3 = (p->vType).pArray[(uint)iStart] & 0xfe;
  if (bVar3 == 6) {
    uVar6 = iStart + 1;
    uVar4 = uVar6 - nObjs;
joined_r0x003a06a0:
    uVar9 = uVar4;
    if (iStart < (int)uVar9) goto LAB_003a06a2;
    uVar18 = (ulong)uVar9;
    if ((long)p_00->nSize < 1) goto LAB_003a11cf;
    if (p_00->pArray[(long)p_00->nSize + -1] != '{') {
      lVar17 = 0;
      do {
        cVar15 = "    \"%s\", "[lVar17 + 8];
        uVar4 = p_00->nCap;
        if (p_00->nSize == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (p_00->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(p_00->pArray,0x10);
            }
            sVar14 = 0x10;
          }
          else {
            sVar14 = (ulong)uVar4 * 2;
            if ((int)sVar14 <= (int)uVar4) goto LAB_003a08bd;
            if (p_00->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar14);
            }
            else {
              pcVar7 = (char *)realloc(p_00->pArray,sVar14);
            }
          }
          p_00->pArray = pcVar7;
          p_00->nCap = (int)sVar14;
        }
LAB_003a08bd:
        iVar8 = p_00->nSize;
        p_00->nSize = iVar8 + 1;
        p_00->pArray[iVar8] = cVar15;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 2);
    }
    if (((int)uVar9 < 0) || (iVar8 = (p->vType).nSize, iVar8 <= (int)uVar9)) goto LAB_003a1134;
    pcVar7 = (p->vType).pArray;
    if ((pcVar7[uVar18] & 0xfcU) != 4) goto LAB_003a1172;
    iVar5 = (p->vFanin).nSize;
    if (iVar5 <= (int)uVar9) goto LAB_003a1153;
    piVar2 = (p->vFanin).pArray;
    iVar16 = piVar2[uVar18];
    lVar17 = (long)iVar16;
    if ((lVar17 < 0) || (iVar8 <= iVar16)) goto LAB_003a1134;
    bVar3 = pcVar7[lVar17];
    if ((9 < bVar3) || ((0x30cU >> (bVar3 & 0x1f) & 1) == 0)) {
LAB_003a120d:
      __assert_fail("Bac_ObjIsCi(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                    ,0x12e,"int Bac_ObjGetConst(Bac_Ntk_t *, int)");
    }
    if ((bVar3 & 0xfe) == 8) {
      if ((iVar16 == 0) || (iVar8 < iVar16)) goto LAB_003a1134;
      if ((byte)(pcVar7[lVar17 + -1] - 0x14U) < 0xf8) goto LAB_003a07a9;
      if (iVar8 < iVar16) goto LAB_003a1134;
      bVar19 = (pcVar7[lVar17 + -1] & 0xfcU) == 0xc;
      uVar4 = uVar9 + 1;
      local_58 = uVar9;
      if ((int)uVar9 < iStart) {
        bVar19 = (pcVar7[lVar17 + -1] & 0xfcU) == 0xc;
        uVar10 = (ulong)(uVar9 + 1);
        uVar12 = uVar18;
        do {
          local_58 = (uint)uVar12;
          if (((int)local_58 < -1) || (uVar4 = local_58 + 1, iVar8 <= (int)uVar4))
          goto LAB_003a1134;
          if ((pcVar7[uVar10] & 0xfcU) != 4) goto LAB_003a1172;
          if (iVar5 <= (int)uVar4) goto LAB_003a1153;
          iVar16 = piVar2[uVar10];
          lVar17 = (long)iVar16;
          if ((lVar17 < 0) || (iVar8 <= iVar16)) goto LAB_003a1134;
          bVar3 = pcVar7[lVar17];
          if ((9 < bVar3) || ((0x30cU >> (bVar3 & 0x1f) & 1) == 0)) goto LAB_003a120d;
          if ((bVar3 & 0xfe) != 8) break;
          if ((iVar16 == 0) || (iVar8 < iVar16)) goto LAB_003a1134;
          if ((byte)(pcVar7[lVar17 + -1] - 0x14U) < 0xf8) break;
          if ((pcVar7[lVar17 + -1] & 0xfcU) != 0xc) {
            bVar19 = false;
          }
          uVar10 = uVar10 + 1;
          uVar13 = local_58 + 1;
          uVar12 = (ulong)uVar13;
          uVar4 = uVar6;
          local_58 = iStart;
        } while ((int)uVar13 < iStart);
      }
      uVar13 = uVar4 - uVar9;
      Vec_StrPrintNum(p_00,uVar13);
      if ((bVar19) && (8 < (int)uVar13)) {
        uVar13 = uVar13 & 3;
        bVar19 = uVar13 == 0;
        lVar17 = 0;
        do {
          cVar15 = "  Node%d [label = \"%d:%d\'h"[lVar17 + 0x18];
          uVar11 = p_00->nCap;
          if (p_00->nSize == uVar11) {
            if ((int)uVar11 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(p_00->pArray,0x10);
              }
              sVar14 = 0x10;
            }
            else {
              sVar14 = (ulong)uVar11 * 2;
              if ((int)sVar14 <= (int)uVar11) goto LAB_003a0d2f;
              if (p_00->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar14);
              }
              else {
                pcVar7 = (char *)realloc(p_00->pArray,sVar14);
              }
            }
            p_00->pArray = pcVar7;
            p_00->nCap = (int)sVar14;
          }
LAB_003a0d2f:
          iVar8 = p_00->nSize;
          p_00->nSize = iVar8 + 1;
          p_00->pArray[iVar8] = cVar15;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 2);
        bVar20 = true;
        if ((int)uVar9 <= (int)local_58) {
          if (uVar13 == 0) {
            uVar13 = 4;
          }
          iVar8 = 0;
          do {
            iVar5 = (p->vType).nSize;
            iVar16 = (int)uVar18;
            if (iVar5 <= iVar16) goto LAB_003a1134;
            pcVar7 = (p->vType).pArray;
            if ((pcVar7[uVar18] & 0xfcU) != 4) goto LAB_003a1172;
            if ((p->vFanin).nSize <= iVar16) goto LAB_003a1153;
            iVar1 = (p->vFanin).pArray[uVar18];
            lVar17 = (long)iVar1;
            if ((lVar17 < 0) || (iVar5 <= iVar1)) goto LAB_003a1134;
            bVar3 = pcVar7[lVar17];
            if ((9 < bVar3) || ((0x30cU >> (bVar3 & 0x1f) & 1) == 0)) goto LAB_003a120d;
            uVar9 = 0;
            if ((bVar3 & 0xfe) == 8) {
              if ((iVar1 == 0) || (iVar5 < iVar1)) goto LAB_003a1134;
              if (0xf7 < (byte)(pcVar7[lVar17 + -1] - 0x14U)) {
                uVar9 = (uint)((byte)pcVar7[lVar17 + -1] >> 1);
              }
            }
            iVar8 = iVar8 * 2 + uVar9;
            if (0x15 < iVar8) {
              __assert_fail("Digit < 16",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x14b,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
            }
            uVar13 = uVar13 - 1;
            if (uVar13 == 0) {
              cVar15 = (char)iVar8 + '*';
              if (0xf < iVar8) {
                cVar15 = (char)iVar8 + 'Q';
              }
              uVar9 = p_00->nCap;
              if (p_00->nSize == uVar9) {
                if ((int)uVar9 < 0x10) {
                  if (p_00->pArray == (char *)0x0) {
                    pcVar7 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar7 = (char *)realloc(p_00->pArray,0x10);
                  }
                  sVar14 = 0x10;
                }
                else {
                  sVar14 = (ulong)uVar9 * 2;
                  if ((int)sVar14 <= (int)uVar9) goto LAB_003a0f42;
                  if (p_00->pArray == (char *)0x0) {
                    pcVar7 = (char *)malloc(sVar14);
                  }
                  else {
                    pcVar7 = (char *)realloc(p_00->pArray,sVar14);
                  }
                }
                p_00->pArray = pcVar7;
                p_00->nCap = (int)sVar14;
              }
LAB_003a0f42:
              iVar8 = p_00->nSize;
              p_00->nSize = iVar8 + 1;
              p_00->pArray[iVar8] = cVar15;
              uVar13 = 4;
              iVar8 = 0;
            }
            else {
              iVar8 = iVar8 + -6;
            }
            uVar18 = uVar18 + 1;
          } while (iVar16 < (int)local_58);
          bVar19 = uVar13 == 4;
          bVar20 = iVar8 == 0;
        }
        if (!bVar19) {
          __assert_fail("nBits == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                        ,0x153,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
        }
        if (!bVar20) {
          __assert_fail("Digit == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                        ,0x154,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
        }
      }
      else {
        lVar17 = 0;
        do {
          cVar15 = "1\'b"[lVar17 + 1];
          uVar13 = p_00->nCap;
          if (p_00->nSize == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(p_00->pArray,0x10);
              }
              sVar14 = 0x10;
            }
            else {
              sVar14 = (ulong)uVar13 * 2;
              if ((int)sVar14 <= (int)uVar13) goto LAB_003a0dc0;
              if (p_00->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar14);
              }
              else {
                pcVar7 = (char *)realloc(p_00->pArray,sVar14);
              }
            }
            p_00->pArray = pcVar7;
            p_00->nCap = (int)sVar14;
          }
LAB_003a0dc0:
          iVar8 = p_00->nSize;
          p_00->nSize = iVar8 + 1;
          p_00->pArray[iVar8] = cVar15;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 2);
        if ((int)uVar9 <= (int)local_58) {
          do {
            iVar8 = (int)uVar18;
            if ((p->vType).nSize <= iVar8) goto LAB_003a1134;
            if (((p->vType).pArray[uVar18] & 0xfcU) != 4) goto LAB_003a1172;
            if ((p->vFanin).nSize <= iVar8) goto LAB_003a1153;
            Bac_ManWriteConstBit(p,(p->vFanin).pArray[uVar18],0);
            uVar18 = uVar18 + 1;
          } while (iVar8 < (int)local_58);
        }
      }
      goto joined_r0x003a06a0;
    }
LAB_003a07a9:
    uVar4 = uVar9 + 1;
    uVar13 = uVar4;
    if ((int)uVar9 < iStart) {
      uVar10 = (ulong)uVar4;
      uVar12 = uVar18;
      do {
        if ((int)uVar4 < 0) goto LAB_003a1134;
        uVar13 = (int)uVar12 + 1;
        if (iVar8 <= (int)uVar13) goto LAB_003a1134;
        if ((pcVar7[uVar10] & 0xfcU) != 4) goto LAB_003a1172;
        if (iVar5 <= (int)uVar13) goto LAB_003a1153;
        if (piVar2[uVar10] != iVar16) break;
        uVar10 = uVar10 + 1;
        uVar11 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar11;
        uVar13 = uVar6;
      } while ((int)uVar11 < iStart);
    }
    if ((int)(uVar9 + 2) < (int)uVar13) {
      Vec_StrPrintNum(p_00,uVar13 - uVar9);
      uVar4 = p_00->nCap;
      if (p_00->nSize == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (p_00->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(p_00->pArray,0x10);
          }
          sVar14 = 0x10;
        }
        else {
          sVar14 = (ulong)uVar4 * 2;
          if ((int)sVar14 <= (int)uVar4) goto LAB_003a100b;
          if (p_00->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar14);
          }
          else {
            pcVar7 = (char *)realloc(p_00->pArray,sVar14);
          }
        }
        p_00->pArray = pcVar7;
        p_00->nCap = (int)sVar14;
      }
LAB_003a100b:
      iVar8 = p_00->nSize;
      p_00->nSize = iVar8 + 1;
      p_00->pArray[iVar8] = '{';
      Bac_ManWriteSig(p,uVar9);
      uVar4 = p_00->nCap;
      if (p_00->nSize == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (p_00->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(p_00->pArray,0x10);
          }
          sVar14 = 0x10;
        }
        else {
          sVar14 = (ulong)uVar4 * 2;
          if ((int)sVar14 <= (int)uVar4) goto LAB_003a1086;
          if (p_00->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar14);
          }
          else {
            pcVar7 = (char *)realloc(p_00->pArray,sVar14);
          }
        }
        p_00->pArray = pcVar7;
        p_00->nCap = (int)sVar14;
      }
LAB_003a1086:
      iVar8 = p_00->nSize;
      p_00->nSize = iVar8 + 1;
      p_00->pArray[iVar8] = '}';
      uVar4 = uVar13;
      goto joined_r0x003a06a0;
    }
    uVar13 = Bac_ObjName(p,iVar16);
    if (uVar13 == 0) goto LAB_003a11b0;
    if ((int)uVar13 < 0) goto LAB_003a1191;
    if ((uVar13 & 3) == 0) {
      Bac_ManWriteVar(p,uVar13 >> 2);
      goto joined_r0x003a06a0;
    }
    uVar13 = uVar4;
    if ((int)uVar9 < iStart) {
      iVar8 = (p->vType).nSize;
      if (iVar8 <= (int)uVar9) goto LAB_003a1134;
      pcVar7 = (p->vType).pArray;
      if ((pcVar7[uVar18] & 0xfcU) != 4) goto LAB_003a1172;
      iVar5 = (p->vFanin).nSize;
      if (iVar5 <= (int)uVar9) goto LAB_003a1153;
      piVar2 = (p->vFanin).pArray;
      lVar17 = 0;
      uVar12 = uVar18;
      do {
        if ((int)uVar4 < 0) goto LAB_003a1134;
        uVar13 = (int)uVar12 + 1;
        if (iVar8 <= (int)uVar13) goto LAB_003a1134;
        if ((pcVar7[lVar17 + (ulong)uVar4] & 0xfcU) != 4) goto LAB_003a1172;
        if (iVar5 <= (int)uVar13) goto LAB_003a1153;
        if ((int)lVar17 + 1 != piVar2[uVar18] - piVar2[(ulong)uVar4 + lVar17]) break;
        uVar11 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar11;
        lVar17 = lVar17 + 1;
        uVar13 = uVar6;
      } while ((int)uVar11 < iStart);
    }
    if ((p->vType).nSize <= (int)uVar9) goto LAB_003a1134;
    if (((p->vType).pArray[uVar18] & 0xfcU) != 4) goto LAB_003a1172;
    if ((p->vFanin).nSize <= (int)uVar9) goto LAB_003a1153;
    iVar8 = Bac_ManFindRealNameId(p,(p->vFanin).pArray[uVar18]);
    Bac_ManWriteVar(p,iVar8);
    iVar8 = (p->vType).nSize;
    if (uVar13 == uVar4) {
      if (iVar8 <= (int)uVar9) goto LAB_003a1134;
      if (((p->vType).pArray[uVar18] & 0xfcU) != 4) {
LAB_003a1172:
        __assert_fail("Bac_ObjIsCo(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
      }
      if ((p->vFanin).nSize <= (int)uVar9) goto LAB_003a1153;
      iVar8 = Bac_ManFindRealIndex(p,(p->vFanin).pArray[uVar18]);
      iVar5 = -1;
    }
    else {
      if (iVar8 < (int)uVar13) goto LAB_003a1134;
      if (((p->vType).pArray[uVar13 - 1] & 0xfcU) != 4) goto LAB_003a1172;
      if ((p->vFanin).nSize < (int)uVar13) {
LAB_003a1153:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = (p->vFanin).pArray[uVar13 - 1];
      uVar4 = Bac_ObjName(p,iVar8);
      if (uVar4 == 0) goto LAB_003a11b0;
      if ((int)uVar4 < 0) goto LAB_003a1191;
      if ((uVar4 & 3) == 0) {
        __assert_fail("Bac_ObjNameType(p, f) != BAC_NAME_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                      ,0x17f,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
      }
      uVar4 = Bac_ObjName(p,iVar8);
      if (uVar4 == 0) goto LAB_003a11b0;
      if ((int)uVar4 < 0) goto LAB_003a1191;
      if (((~uVar4 & 3) != 0) &&
         (iVar5 = Bac_ObjGetRange(p,iVar8), uVar4 = uVar13, iVar5 == uVar13 - uVar9))
      goto joined_r0x003a06a0;
      iVar8 = Bac_ManFindRealIndex(p,iVar8);
      if ((p->vType).nSize <= (int)uVar9) goto LAB_003a1134;
      if (((p->vType).pArray[uVar18] & 0xfcU) != 4) goto LAB_003a1172;
      if ((p->vFanin).nSize <= (int)uVar9) goto LAB_003a1153;
      iVar5 = Bac_ManFindRealIndex(p,(p->vFanin).pArray[uVar18]);
    }
    Bac_ManWriteRange(p,iVar8,iVar5);
    uVar4 = uVar13;
    goto joined_r0x003a06a0;
  }
  if (bVar3 != 8) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x187,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
  }
  iVar8 = nObjs + iStart;
  do {
    iVar8 = iVar8 + -1;
    uVar4 = Bac_ObjName(p,iVar8);
    if (uVar4 == 0) {
LAB_003a11b0:
      __assert_fail("n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                    ,0x107,"Bac_NameType_t Bac_NameType(int)");
    }
    if ((int)uVar4 < 0) {
LAB_003a1191:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x13e,"int Abc_Lit2Att2(int)");
    }
    if ((~uVar4 & 3) != 0) {
      if ((long)p_00->nSize < 1) {
LAB_003a11cf:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x197,"char Vec_StrEntryLast(Vec_Str_t *)");
      }
      if (p_00->pArray[(long)p_00->nSize + -1] != '{') {
        lVar17 = 0;
        do {
          cVar15 = "    \"%s\", "[lVar17 + 8];
          uVar4 = p_00->nCap;
          if (p_00->nSize == uVar4) {
            if ((int)uVar4 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(p_00->pArray,0x10);
              }
              sVar14 = 0x10;
            }
            else {
              sVar14 = (ulong)uVar4 * 2;
              if ((int)sVar14 <= (int)uVar4) goto LAB_003a0669;
              if (p_00->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar14);
              }
              else {
                pcVar7 = (char *)realloc(p_00->pArray,sVar14);
              }
            }
            p_00->pArray = pcVar7;
            p_00->nCap = (int)sVar14;
          }
LAB_003a0669:
          iVar5 = p_00->nSize;
          p_00->nSize = iVar5 + 1;
          p_00->pArray[iVar5] = cVar15;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 2);
      }
      iVar5 = Bac_ManFindRealNameId(p,iVar8);
      Bac_ManWriteVar(p,iVar5);
    }
  } while (iStart < iVar8);
LAB_003a06a2:
  uVar4 = p_00->nCap;
  if (p_00->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(p_00->pArray,0x10);
      }
      sVar14 = 0x10;
    }
    else {
      sVar14 = (ulong)uVar4 * 2;
      if ((int)sVar14 <= (int)uVar4) goto LAB_003a10fc;
      if (p_00->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar14);
      }
      else {
        pcVar7 = (char *)realloc(p_00->pArray,sVar14);
      }
    }
    p_00->pArray = pcVar7;
    p_00->nCap = (int)sVar14;
  }
LAB_003a10fc:
  iVar8 = p_00->nSize;
  p_00->nSize = iVar8 + 1;
  p_00->pArray[iVar8] = '}';
  return;
}

Assistant:

static inline void Bac_ManWriteConcat( Bac_Ntk_t * p, int iStart, int nObjs )
{
    Vec_Str_t * vStr = p->pDesign->vOut; 
    assert( nObjs >= 1 );
    if ( nObjs == 1 )
    {
        Bac_ManWriteSig( p, iStart );
        return;
    }
    Vec_StrPrintStr( vStr, "{" );
    if ( Bac_ObjIsBo(p, iStart) ) // box output
    {
        int i;
        for ( i = iStart + nObjs - 1; i >= iStart; i-- )
        {
            if ( Bac_ObjNameType(p, i) == BAC_NAME_INDEX )
                continue;
            if ( Vec_StrEntryLast(vStr) != '{' )
                Vec_StrPrintStr( vStr, ", " );
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, i) );
        }
    }
    else if ( Bac_ObjIsBi(p, iStart) ) // box input
    {
        int e, b, k, NameId;
        for ( e = iStart - nObjs + 1; e <= iStart; )
        {
            if ( Vec_StrEntryLast(vStr) != '{' )
                Vec_StrPrintStr( vStr, ", " );
            // write constant
            if ( Bac_ObjGetConst(p, Bac_ObjFanin(p, e)) )
            {
                int fBinary = Bac_ObjIsConstBin(p, Bac_ObjFanin(p, e)-1);                
                for ( b = e + 1; b <= iStart; b++ )
                {
                    if ( !Bac_ObjGetConst(p, Bac_ObjFanin(p, b)) )
                        break;
                    if ( !Bac_ObjIsConstBin(p, Bac_ObjFanin(p, b)-1) )
                        fBinary = 0;
                }
                Vec_StrPrintNum( vStr, b - e );
                if ( fBinary && b - e > 8 ) // write hex if more than 8 bits
                {
                    int Digit = 0, nBits = ((b - e) & 3) ? (b - e) & 3 : 4;
                    Vec_StrPrintStr( vStr, "\'h" );
                    for ( k = e; k < b; k++ )
                    {
                        Digit = 2*Digit + Bac_ObjGetConst(p, Bac_ObjFanin(p, k)) - BAC_BOX_CF;
                        assert( Digit < 16 );
                        if ( --nBits == 0 )
                        {
                            Vec_StrPush( vStr, (char)(Digit < 10 ? '0' + Digit : 'a' + Digit - 10) );
                            nBits = 4;
                            Digit = 0;
                        }
                    }
                    assert( nBits == 4 );
                    assert( Digit == 0 );
                }
                else
                {
                    Vec_StrPrintStr( vStr, "\'b" );
                    for ( k = e; k < b; k++ )
                        Bac_ManWriteConstBit( p, Bac_ObjFanin(p, k), 0 );
                }
                e = b;
                continue;
            }
            // try replication
            for ( b = e + 1; b <= iStart; b++ )
                if ( Bac_ObjFanin(p, b) != Bac_ObjFanin(p, e) )
                    break;
            if ( b > e + 2 ) // more than two
            {
                Vec_StrPrintNum( vStr, b - e );
                Vec_StrPrintStr( vStr, "{" );
                Bac_ManWriteSig( p, e );
                Vec_StrPrintStr( vStr, "}" );
                e = b;
                continue;
            }
            NameId = Bac_ObjName(p, Bac_ObjFanin(p, e));
            if ( Bac_NameType(NameId) == BAC_NAME_BIN )
            {
                Bac_ManWriteVar( p, Abc_Lit2Var2(NameId) );
                e++;
                continue;
            }
            // find end of the slice
            for ( b = e + 1; b <= iStart; b++ )
                if ( Bac_ObjFanin(p, e) - Bac_ObjFanin(p, b) != b - e )
                    break;
            // write signal name
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, Bac_ObjFanin(p, e)) );
            if ( b == e + 1 ) // literal
                Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, Bac_ObjFanin(p, e)), -1 );
            else // slice or complete variable
            {
                // consider first variable of the slice
                int f = Bac_ObjFanin( p, b-1 );
                assert( Bac_ObjNameType(p, f) != BAC_NAME_BIN );
                if ( Bac_ObjNameType(p, f) == BAC_NAME_INDEX || Bac_ObjGetRange(p, f) != b - e ) // slice
                    Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, f), Bac_ManFindRealIndex(p, Bac_ObjFanin(p, e)) );
                // else this is complete variable
            }
            e = b;
        }
    }
    else assert( 0 );
    Vec_StrPrintStr( vStr, "}" );
}